

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O1

void __thiscall OpenMD::MoleculeCreator::createConstraintPair(MoleculeCreator *this,Molecule *mol)

{
  double dVar1;
  BondType *pBVar2;
  int iVar3;
  long lVar4;
  ConstraintElem *this_00;
  ConstraintElem *this_01;
  ConstraintPair *cp;
  undefined8 uVar5;
  pointer ppBVar6;
  Bond *pBVar7;
  
  ppBVar6 = (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar6 ==
      (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar7 = (Bond *)0x0;
  }
  else {
    pBVar7 = *ppBVar6;
  }
  while( true ) {
    if (pBVar7 == (Bond *)0x0) {
      return;
    }
    ppBVar6 = ppBVar6 + 1;
    pBVar2 = pBVar7->bondType_;
    if (pBVar2 == (BondType *)0x0) break;
    if ((*(char **)(pBVar2->_vptr_BondType[-1] + 8) == "N6OpenMD13FixedBondTypeE") ||
       (iVar3 = strcmp("N6OpenMD13FixedBondTypeE",*(char **)(pBVar2->_vptr_BondType[-1] + 8)),
       iVar3 == 0)) {
      lVar4 = __dynamic_cast(pBVar2,&BondType::typeinfo,&FixedBondType::typeinfo,0);
      this_00 = (ConstraintElem *)operator_new(0x28);
      ConstraintElem::ConstraintElem
                (this_00,&(*(pBVar7->super_ShortRangeInteraction).atoms_.
                            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                            _M_impl.super__Vector_impl_data._M_start)->super_StuntDouble);
      this_01 = (ConstraintElem *)operator_new(0x28);
      ConstraintElem::ConstraintElem
                (this_01,&(pBVar7->super_ShortRangeInteraction).atoms_.
                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[1]->super_StuntDouble);
      cp = (ConstraintPair *)operator_new(0x28);
      dVar1 = *(double *)(lVar4 + 8);
      cp->consElem1_ = this_00;
      cp->consElem2_ = this_01;
      cp->dist2 = dVar1 * dVar1;
      cp->force_ = 0.0;
      cp->printForce_ = false;
      Molecule::addConstraintPair(mol,cp);
    }
    if (ppBVar6 ==
        (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pBVar7 = (Bond *)0x0;
    }
    else {
      pBVar7 = *ppBVar6;
    }
  }
  uVar5 = __cxa_bad_typeid();
  operator_delete((void *)0x0,0x28);
  _Unwind_Resume(uVar5);
}

Assistant:

void MoleculeCreator::createConstraintPair(Molecule* mol) {
    // add bond constraints
    Molecule::BondIterator bi;
    Bond* bond;
    ConstraintPair* cPair;

    for (bond = mol->beginBond(bi); bond != NULL; bond = mol->nextBond(bi)) {
      BondType* bt = bond->getBondType();

      if (typeid(FixedBondType) == typeid(*bt)) {
        FixedBondType* fbt = dynamic_cast<FixedBondType*>(bt);

        ConstraintElem* consElemA = new ConstraintElem(bond->getAtomA());
        ConstraintElem* consElemB = new ConstraintElem(bond->getAtomB());
        cPair                     = new ConstraintPair(consElemA, consElemB,
                                                       fbt->getEquilibriumBondLength(), false);
        mol->addConstraintPair(cPair);
      }
    }

    // rigidbody -- rigidbody constraint is not support yet
  }